

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerOpenSavepoint(Pager *pPager,int nSavepoint)

{
  int iVar1;
  PagerSavepoint *pPVar2;
  Bitvec *pBVar3;
  int in_ESI;
  Pager *in_RDI;
  PagerSavepoint *aNew;
  int ii;
  int nCurrent;
  int rc;
  u32 local_20;
  u32 iSize;
  int local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_18 = 0;
  local_20 = in_RDI->nSavepoint;
  if (((int)local_20 < in_ESI) && (in_RDI->useJournal != '\0')) {
    pPVar2 = (PagerSavepoint *)
             sqlite3Realloc((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (u64)in_RDI);
    if (pPVar2 == (PagerSavepoint *)0x0) {
      local_18 = 7;
    }
    else {
      memset(pPVar2 + (int)local_20,0,(long)(int)(in_ESI - local_20) * 0x30);
      in_RDI->aSavepoint = pPVar2;
      iSize = local_20;
      for (; (int)local_20 < in_ESI; local_20 = local_20 + 1) {
        pPVar2[(int)local_20].nOrig = in_RDI->dbSize;
        if ((in_RDI->jfd->pMethods == (sqlite3_io_methods *)0x0) || (in_RDI->journalOff < 1)) {
          pPVar2[(int)local_20].iOffset = (ulong)in_RDI->sectorSize;
        }
        else {
          pPVar2[(int)local_20].iOffset = in_RDI->journalOff;
        }
        pPVar2[(int)local_20].iSubRec = in_RDI->nSubRec;
        pBVar3 = sqlite3BitvecCreate(iSize);
        pPVar2[(int)local_20].pInSavepoint = pBVar3;
        if (pPVar2[(int)local_20].pInSavepoint == (Bitvec *)0x0) {
          return 7;
        }
        iVar1 = pagerUseWal(in_RDI);
        if (iVar1 != 0) {
          sqlite3WalSavepoint(in_RDI->pWal,pPVar2[(int)local_20].aWalData);
        }
        in_RDI->nSavepoint = local_20 + 1;
      }
    }
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerOpenSavepoint(Pager *pPager, int nSavepoint){
  int rc = SQLITE_OK;                       /* Return code */
  int nCurrent = pPager->nSavepoint;        /* Current number of savepoints */

  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );

  if( nSavepoint>nCurrent && pPager->useJournal ){
    int ii;                                 /* Iterator variable */
    PagerSavepoint *aNew;                   /* New Pager.aSavepoint array */

    /* Grow the Pager.aSavepoint array using realloc(). Return SQLITE_NOMEM
    ** if the allocation fails. Otherwise, zero the new portion in case a 
    ** malloc failure occurs while populating it in the for(...) loop below.
    */
    aNew = (PagerSavepoint *)sqlite3Realloc(
        pPager->aSavepoint, sizeof(PagerSavepoint)*nSavepoint
    );
    if( !aNew ){
      return SQLITE_NOMEM;
    }
    memset(&aNew[nCurrent], 0, (nSavepoint-nCurrent) * sizeof(PagerSavepoint));
    pPager->aSavepoint = aNew;

    /* Populate the PagerSavepoint structures just allocated. */
    for(ii=nCurrent; ii<nSavepoint; ii++){
      aNew[ii].nOrig = pPager->dbSize;
      if( isOpen(pPager->jfd) && pPager->journalOff>0 ){
        aNew[ii].iOffset = pPager->journalOff;
      }else{
        aNew[ii].iOffset = JOURNAL_HDR_SZ(pPager);
      }
      aNew[ii].iSubRec = pPager->nSubRec;
      aNew[ii].pInSavepoint = sqlite3BitvecCreate(pPager->dbSize);
      if( !aNew[ii].pInSavepoint ){
        return SQLITE_NOMEM;
      }
      if( pagerUseWal(pPager) ){
        sqlite3WalSavepoint(pPager->pWal, aNew[ii].aWalData);
      }
      pPager->nSavepoint = ii+1;
    }
    assert( pPager->nSavepoint==nSavepoint );
    assertTruncateConstraint(pPager);
  }

  return rc;
}